

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O1

system_error * fmt::v10::vsystem_error(int error_code,string_view fmt,format_args args)

{
  error_category *peVar1;
  undefined4 in_register_0000003c;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  aVar2;
  error_code __ec;
  format_args args_00;
  string local_50;
  
  __ec._M_value = (uint)fmt.data_;
  aVar2 = in_R9;
  peVar1 = (error_category *)std::_V2::generic_category();
  args_00.field_1.values_ = aVar2.values_;
  args_00.desc_ = (unsigned_long_long)in_R9.values_;
  vformat_abi_cxx11_(&local_50,(v10 *)fmt.size_,(string_view)args,args_00);
  __ec._4_4_ = 0;
  __ec._M_cat = peVar1;
  std::system_error::system_error
            ((system_error *)CONCAT44(in_register_0000003c,error_code),__ec,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return (system_error *)CONCAT44(in_register_0000003c,error_code);
}

Assistant:

FMT_FUNC auto vsystem_error(int error_code, string_view fmt, format_args args)
    -> std::system_error {
  auto ec = std::error_code(error_code, std::generic_category());
  return std::system_error(ec, vformat(fmt, args));
}